

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemoryCopyExpr
          (BinaryReaderIR *this,Index srcmemidx,Index destmemidx)

{
  undefined4 index;
  Location local_100;
  Var local_e0;
  Location local_98;
  Var local_78;
  undefined1 local_30 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  undefined1 local_20 [8];
  Index destmemidx_local;
  Index srcmemidx_local;
  BinaryReaderIR *this_local;
  
  local_20._0_4_ = destmemidx;
  local_20._4_4_ = srcmemidx;
  _destmemidx_local = this;
  GetLocation(&local_98,this);
  Var::Var(&local_78,srcmemidx,&local_98);
  index = local_20._0_4_;
  GetLocation(&local_100,this);
  Var::Var(&local_e0,index,&local_100);
  std::make_unique<wabt::MemoryBinaryExpr<(wabt::ExprType)28>,wabt::Var,wabt::Var>
            ((Var *)local_30,&local_78);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>,std::default_delete<wabt::MemoryBinaryExpr<(wabt::ExprType)28>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,
             (unique_ptr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>,_std::default_delete<wabt::MemoryBinaryExpr<(wabt::ExprType)28>_>_>
              *)local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::
  unique_ptr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>,_std::default_delete<wabt::MemoryBinaryExpr<(wabt::ExprType)28>_>_>
  ::~unique_ptr((unique_ptr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>,_std::default_delete<wabt::MemoryBinaryExpr<(wabt::ExprType)28>_>_>
                 *)local_30);
  Var::~Var(&local_e0);
  Var::~Var(&local_78);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnMemoryCopyExpr(Index srcmemidx, Index destmemidx) {
  return AppendExpr(std::make_unique<MemoryCopyExpr>(
      Var(srcmemidx, GetLocation()), Var(destmemidx, GetLocation())));
}